

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

unsigned_long decode_codec_id(uchar *codecId,size_t id_size)

{
  unsigned_long local_28;
  unsigned_long id;
  uint i;
  size_t id_size_local;
  uchar *codecId_local;
  
  local_28 = 0;
  for (id._4_4_ = 0; id._4_4_ < id_size; id._4_4_ = id._4_4_ + 1) {
    local_28 = (ulong)codecId[id._4_4_] + local_28 * 0x100;
  }
  return local_28;
}

Assistant:

static unsigned long
decode_codec_id(const unsigned char *codecId, size_t id_size)
{
	unsigned i;
	unsigned long id = 0;

	for (i = 0; i < id_size; i++) {
		id <<= 8;
		id += codecId[i];
	}
	return (id);
}